

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

uint tryfuncTM(lua_State *L,StkId func,uint status)

{
  StkId pSVar1;
  TValue *pTVar2;
  TValue *io1;
  TValue *io1_1;
  
  pTVar2 = luaT_gettmbyobj(L,&func->val,TM_CALL);
  if ((pTVar2->tt_ & 0xf) == 0) {
    luaG_callerror(L,&func->val);
  }
  for (pSVar1 = (L->top).p; func < pSVar1; pSVar1 = pSVar1 + -1) {
    (pSVar1->val).value_ = pSVar1[-1].val.value_;
    (pSVar1->val).tt_ = *(lu_byte *)((long)pSVar1 - 8);
  }
  (L->top).p = (StkId)((L->top).offset + 0x10);
  (func->val).value_ = pTVar2->value_;
  (func->val).tt_ = pTVar2->tt_;
  if ((~status & 0xf00) == 0) {
    luaG_runerror(L,"\'__call\' chain too long");
  }
  return status + 0x100;
}

Assistant:

static unsigned tryfuncTM (lua_State *L, StkId func, unsigned status) {
  const TValue *tm;
  StkId p;
  tm = luaT_gettmbyobj(L, s2v(func), TM_CALL);
  if (l_unlikely(ttisnil(tm)))  /* no metamethod? */
    luaG_callerror(L, s2v(func));
  for (p = L->top.p; p > func; p--)  /* open space for metamethod */
    setobjs2s(L, p, p-1);
  L->top.p++;  /* stack space pre-allocated by the caller */
  setobj2s(L, func, tm);  /* metamethod is the new function to be called */
  if ((status & MAX_CCMT) == MAX_CCMT)  /* is counter full? */
    luaG_runerror(L, "'__call' chain too long");
  return status + (1u << CIST_CCMT);  /* increment counter */
}